

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::InterfaceVariableAccessHandler::handle
          (InterfaceVariableAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  Variant *pVVar4;
  SPIRVariable *pSVar5;
  SPIRExtension *pSVar6;
  ulong uVar7;
  bool bVar8;
  uint32_t i;
  ulong uVar9;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  bVar8 = true;
  if ((int)opcode < 0xa9) {
    switch(opcode) {
    case OpFunctionCall:
      if (2 < length) {
        if (length - 3 == 0) {
          return true;
        }
        uVar9 = 0;
        do {
          uVar7 = (ulong)args[uVar9 + 3];
          if ((uVar7 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar4[uVar7].type == TypeVariable)) {
            pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar7);
            if ((pSVar5->storage < (StorageBuffer|Input)) &&
               ((0x160fU >> (pSVar5->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar9 + 3];
              ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar9 = uVar9 + 1;
        } while (length - 3 != uVar9);
        return true;
      }
      break;
    case OpFunctionEnd|OpSourceContinued:
    case OpVariable:
    case OpCopyMemorySized:
      goto switchD_003278c6_caseD_f3;
    case OpImageTexelPointer:
    case OpLoad:
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
    case OpArrayLength:
switchD_003278c6_caseD_e3:
      if (2 < length) {
        args = args + 2;
LAB_00327979:
        uVar1 = *args;
        uVar9 = (ulong)uVar1;
        if (uVar9 == 0) {
          return true;
        }
        if ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size <=
            uVar9) {
          return true;
        }
        pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
        if (pVVar4[uVar9].type != TypeVariable) {
          return true;
        }
        pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        if (StorageBuffer < pSVar5->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar5->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = uVar1;
LAB_003279d5:
        ::std::
        _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                  ();
        return true;
      }
      break;
    case OpStore:
      goto switchD_003278c6_caseD_e4;
    case OpCopyMemory:
      if (1 < length) {
        uVar9 = (ulong)*args;
        if ((uVar9 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                     buffer_size) &&
           (pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
           pVVar4[uVar9].type == TypeVariable)) {
          pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar9);
          if ((pSVar5->storage < (StorageBuffer|Input)) &&
             ((0x160fU >> (pSVar5->storage & 0x1f) & 1) != 0)) {
            local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this->variables;
            local_3c = *args;
            ::std::
            _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                      ();
          }
        }
        uVar9 = (ulong)args[1];
        if ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size <=
            uVar9) {
          return true;
        }
        pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
        if (pVVar4[uVar9].type != TypeVariable) {
          return true;
        }
        pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        if (StorageBuffer < pSVar5->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar5->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = args[1];
        goto LAB_003279d5;
      }
      break;
    default:
      if (opcode != OpExtInst) {
        if (opcode != OpCopyObject) {
          return true;
        }
        goto switchD_003278c6_caseD_e3;
      }
      if (2 < length) {
        pSVar6 = Variant::get<diligent_spirv_cross::SPIRExtension>
                           ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>
                            .ptr + args[2]);
        iVar2 = *(int *)&(pSVar6->super_IVariant).field_0xc;
        if (iVar2 == 4) {
          if (args[3] != 1) {
            return true;
          }
        }
        else {
          if (iVar2 != 1) {
            return true;
          }
          uVar3 = args[3];
          if (2 < uVar3 - 0x4c) {
            if ((uVar3 != 10) && (uVar3 != 0x23)) {
              return true;
            }
            uVar9 = (ulong)args[5];
            if ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size
                <= uVar9) {
              return true;
            }
            pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
            if (pVVar4[uVar9].type != TypeVariable) {
              return true;
            }
            pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar9);
            if (StorageBuffer < pSVar5->storage) {
              return true;
            }
            if ((0x160fU >> (pSVar5->storage & 0x1f) & 1) == 0) {
              return true;
            }
            local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this->variables;
            local_3c = args[5];
            goto LAB_003279d5;
          }
        }
        uVar9 = (ulong)args[4];
        if ((this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size <=
            uVar9) {
          return true;
        }
        pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
        if (pVVar4[uVar9].type != TypeVariable) {
          return true;
        }
        pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        if (StorageBuffer < pSVar5->storage) {
          return true;
        }
        if ((0x160fU >> (pSVar5->storage & 0x1f) & 1) == 0) {
          return true;
        }
        local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this->variables;
        local_3c = args[4];
        goto LAB_003279d5;
      }
    }
  }
  else {
    switch(opcode) {
    case OpAtomicLoad:
    case OpAtomicExchange:
    case OpAtomicCompareExchange:
    case OpAtomicCompareExchangeWeak:
    case OpAtomicIIncrement:
    case OpAtomicIDecrement:
    case OpAtomicIAdd:
    case OpAtomicISub:
    case OpAtomicSMin:
    case OpAtomicUMin:
    case OpAtomicSMax:
    case OpAtomicUMax:
    case OpAtomicAnd:
    case OpAtomicOr:
    case OpAtomicXor:
      goto switchD_003278c6_caseD_e3;
    case OpAtomicStore:
switchD_003278c6_caseD_e4:
      if (length != 0) goto LAB_00327979;
      break;
    case OpAtomicXor|OpUndef:
    case OpAtomicAnd|OpSourceExtension:
      goto switchD_003278c6_caseD_f3;
    case OpPhi:
      if (1 < length) {
        if (length - 2 == 0) {
          return true;
        }
        uVar9 = 0;
        do {
          uVar7 = (ulong)args[uVar9 + 2];
          if ((uVar7 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar4[uVar7].type == TypeVariable)) {
            pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar7);
            if ((pSVar5->storage < (StorageBuffer|Input)) &&
               ((0x160fU >> (pSVar5->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar9 + 2];
              ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar9 = uVar9 + 2;
        } while (uVar9 < length - 2);
        return true;
      }
      break;
    default:
      if (opcode != OpSelect) {
        return true;
      }
      if (4 < length) {
        uVar9 = 0;
        do {
          uVar7 = (ulong)args[uVar9 + 3];
          if ((uVar7 < (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                       buffer_size) &&
             (pVVar4 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
             pVVar4[uVar7].type == TypeVariable)) {
            pSVar5 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar4 + uVar7);
            if ((pSVar5->storage < (StorageBuffer|Input)) &&
               ((0x160fU >> (pSVar5->storage & 0x1f) & 1) != 0)) {
              local_38 = (_Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)this->variables;
              local_3c = args[uVar9 + 3];
              ::std::
              _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::allocator<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Identity,std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,true>>>>
                        (local_38,&local_3c,&local_38);
            }
          }
          uVar9 = uVar9 + 1;
        } while (length - 3 != uVar9);
        return true;
      }
    }
  }
  bVar8 = false;
switchD_003278c6_caseD_f3:
  return bVar8;
}

Assistant:

bool Compiler::InterfaceVariableAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	uint32_t variable = 0;
	switch (opcode)
	{
	// Need this first, otherwise, GCC complains about unhandled switch statements.
	default:
		break;

	case OpFunctionCall:
	{
		// Invalid SPIR-V.
		if (length < 3)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpSelect:
	{
		// Invalid SPIR-V.
		if (length < 5)
			return false;

		uint32_t count = length - 3;
		args += 3;
		for (uint32_t i = 0; i < count; i++)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpPhi:
	{
		// Invalid SPIR-V.
		if (length < 2)
			return false;

		uint32_t count = length - 2;
		args += 2;
		for (uint32_t i = 0; i < count; i += 2)
		{
			auto *var = compiler.maybe_get<SPIRVariable>(args[i]);
			if (var && storage_class_is_interface(var->storage))
				variables.insert(args[i]);
		}
		break;
	}

	case OpAtomicStore:
	case OpStore:
		// Invalid SPIR-V.
		if (length < 1)
			return false;
		variable = args[0];
		break;

	case OpCopyMemory:
	{
		if (length < 2)
			return false;

		auto *var = compiler.maybe_get<SPIRVariable>(args[0]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[0]);

		var = compiler.maybe_get<SPIRVariable>(args[1]);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(args[1]);
		break;
	}

	case OpExtInst:
	{
		if (length < 3)
			return false;
		auto &extension_set = compiler.get<SPIRExtension>(args[2]);
		switch (extension_set.ext)
		{
		case SPIRExtension::GLSL:
		{
			auto op = static_cast<GLSLstd450>(args[3]);

			switch (op)
			{
			case GLSLstd450InterpolateAtCentroid:
			case GLSLstd450InterpolateAtSample:
			case GLSLstd450InterpolateAtOffset:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			case GLSLstd450Modf:
			case GLSLstd450Fract:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[5]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[5]);
				break;
			}

			default:
				break;
			}
			break;
		}
		case SPIRExtension::SPV_AMD_shader_explicit_vertex_parameter:
		{
			enum AMDShaderExplicitVertexParameter
			{
				InterpolateAtVertexAMD = 1
			};

			auto op = static_cast<AMDShaderExplicitVertexParameter>(args[3]);

			switch (op)
			{
			case InterpolateAtVertexAMD:
			{
				auto *var = compiler.maybe_get<SPIRVariable>(args[4]);
				if (var && storage_class_is_interface(var->storage))
					variables.insert(args[4]);
				break;
			}

			default:
				break;
			}
			break;
		}
		default:
			break;
		}
		break;
	}

	case OpAccessChain:
	case OpInBoundsAccessChain:
	case OpPtrAccessChain:
	case OpLoad:
	case OpCopyObject:
	case OpImageTexelPointer:
	case OpAtomicLoad:
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpArrayLength:
		// Invalid SPIR-V.
		if (length < 3)
			return false;
		variable = args[2];
		break;
	}

	if (variable)
	{
		auto *var = compiler.maybe_get<SPIRVariable>(variable);
		if (var && storage_class_is_interface(var->storage))
			variables.insert(variable);
	}
	return true;
}